

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::JsonUnitTestResultPrinter::OnTestIterationEnd
          (JsonUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  FILE *__stream;
  stringstream stream;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  __stream = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream(local_1a0);
  PrintJsonUnitTest(local_190,unit_test);
  StringStreamToString(&local_1c0,(stringstream *)local_1a0);
  fputs(local_1c0._M_dataplus._M_p,__stream);
  std::__cxx11::string::_M_dispose();
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                   int /*iteration*/) {
  FILE* jsonout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintJsonUnitTest(&stream, unit_test);
  fprintf(jsonout, "%s", StringStreamToString(&stream).c_str());
  fclose(jsonout);
}